

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  BYTE *src;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  ZSTD_nextInputType_e ZVar6;
  char *pcVar7;
  size_t sVar8;
  bool bVar9;
  void *pvVar10;
  ulong uVar11;
  ZSTD_dStage ZVar12;
  void *pvVar13;
  void *src_00;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  void *src_01;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sStackY_c0;
  void *local_98;
  
  uVar18 = input->pos;
  uVar2 = input->size;
  if (uVar2 < uVar18) {
    sStackY_c0 = 0xffffffffffffffb8;
  }
  else {
    uVar3 = output->size;
    if (uVar3 < output->pos) {
      sStackY_c0 = 0xffffffffffffffba;
    }
    else {
      src_00 = (void *)(uVar18 + (long)input->src);
      pvVar10 = (void *)(uVar2 + (long)input->src);
      pvVar4 = output->dst;
      pvVar13 = (void *)(output->pos + (long)pvVar4);
      src = zds->headerBuffer;
      bVar9 = false;
      pvVar5 = src_00;
      local_98 = pvVar13;
LAB_0018691f:
      while (src_01 = pvVar5, !bVar9) {
        switch(zds->streamStage) {
        case zdss_init:
          zds->streamStage = zdss_loadHeader;
          zds->inPos = 0;
          zds->legacyVersion = 0;
          zds->hostageByte = 0;
          zds->outStart = 0;
          zds->outEnd = 0;
          zds->lhSize = 0;
          sVar17 = 0;
          break;
        case zdss_loadHeader:
          sVar17 = zds->lhSize;
          break;
        case zdss_read:
          goto switchD_00186949_caseD_2;
        case zdss_load:
          sVar17 = zds->expected;
          goto LAB_00186bfc;
        case zdss_flush:
          sVar17 = zds->outStart;
          sVar8 = zds->outEnd;
          goto LAB_00186d20;
        default:
          return 0xffffffffffffffff;
        }
        sVar17 = ZSTD_getFrameHeader_advanced(&zds->fParams,src,sVar17,zds->format);
        if (0xffffffffffffff88 < sVar17) {
          return sVar17;
        }
        if (sVar17 != 0) {
          sVar8 = zds->lhSize;
          uVar14 = sVar17 - sVar8;
          uVar15 = (long)pvVar10 - (long)src_01;
          if (uVar15 < uVar14) {
            if (pvVar10 != src_01) {
              memcpy(src + sVar8,src_01,uVar15);
              sVar8 = uVar15 + zds->lhSize;
              zds->lhSize = sVar8;
            }
            input->pos = input->size;
            sVar16 = 6;
            if (6 < sVar17) {
              sVar16 = sVar17;
            }
            return (sVar16 - sVar8) + 3;
          }
          memcpy(src + sVar8,src_01,uVar14);
          zds->lhSize = sVar17;
          src_01 = (void *)((long)src_01 + uVar14);
          goto LAB_00186e10;
        }
        uVar14 = (zds->fParams).frameContentSize;
        if ((((uVar14 == 0) || ((zds->fParams).windowSize == 0)) ||
            (uVar15 = (long)pvVar4 + (uVar3 - (long)local_98), uVar15 < uVar14)) ||
           (sVar17 = ZSTD_findFrameCompressedSize(src_00,uVar2 - uVar18), uVar2 - uVar18 < sVar17))
        {
          ZSTD_decompressBegin_usingDDict(zds,zds->ddict);
          if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
            uVar14 = (ulong)*(uint *)(zds->headerBuffer + 4);
            ZVar12 = ZSTDds_skipFrame;
          }
          else {
            sVar17 = ZSTD_decodeFrameHeader(zds,src,zds->lhSize);
            uVar14 = 3;
            ZVar12 = ZSTDds_decodeBlockHeader;
            if (0xffffffffffffff88 < sVar17) {
              return sVar17;
            }
          }
          zds->expected = uVar14;
          zds->stage = ZVar12;
          uVar14 = (zds->fParams).windowSize;
          if (uVar14 < 0x401) {
            uVar14 = 0x400;
          }
          (zds->fParams).windowSize = uVar14;
          if (zds->maxWindowSize < uVar14) {
            return 0xfffffffffffffff0;
          }
          uVar1 = (zds->fParams).blockSizeMax;
          uVar15 = (ulong)uVar1;
          if (uVar1 < 5) {
            uVar15 = 4;
          }
          uVar19 = (zds->fParams).frameContentSize;
          uVar11 = 0x20000;
          if (uVar14 < 0x20000) {
            uVar11 = uVar14;
          }
          uVar14 = uVar14 + uVar11 + 0x10;
          if (uVar14 < uVar19) {
            uVar19 = uVar14;
          }
          if ((zds->inBuffSize < uVar15) || (zds->outBuffSize < uVar19)) {
            if (zds->staticSize == 0) {
              ZSTD_free(zds->inBuff,zds->customMem);
              zds->inBuffSize = 0;
              zds->outBuffSize = 0;
              pcVar7 = (char *)ZSTD_malloc(uVar15 + uVar19,zds->customMem);
              zds->inBuff = pcVar7;
              if (pcVar7 == (char *)0x0) {
                return 0xffffffffffffffc0;
              }
            }
            else {
              if (zds->staticSize - 0x271e8 < uVar15 + uVar19) {
                return 0xffffffffffffffc0;
              }
              pcVar7 = zds->inBuff;
            }
            zds->inBuffSize = uVar15;
            zds->outBuff = pcVar7 + uVar15;
            zds->outBuffSize = uVar19;
          }
          zds->streamStage = zdss_read;
switchD_00186949_caseD_2:
          sVar17 = zds->expected;
          if (sVar17 == 0) {
            zds->streamStage = zdss_init;
            bVar9 = true;
            pvVar5 = src_01;
          }
          else {
            if (sVar17 <= (ulong)((long)pvVar10 - (long)src_01)) goto LAB_00186ce8;
            bVar9 = true;
            pvVar5 = pvVar10;
            if (src_01 != pvVar10) {
              zds->streamStage = zdss_load;
LAB_00186bfc:
              sVar8 = zds->inPos;
              uVar14 = sVar17 - sVar8;
              ZVar12 = zds->stage;
              if (ZVar12 == ZSTDds_skipFrame) {
                uVar15 = (long)pvVar10 - (long)src_01;
                if (uVar14 < (ulong)((long)pvVar10 - (long)src_01)) {
                  uVar15 = uVar14;
                }
              }
              else {
                if (zds->inBuffSize - sVar8 < uVar14) {
                  return 0xffffffffffffffec;
                }
                uVar15 = (long)pvVar10 - (long)src_01;
                if (uVar14 < (ulong)((long)pvVar10 - (long)src_01)) {
                  uVar15 = uVar14;
                }
                memcpy(zds->inBuff + sVar8,src_01,uVar15);
                sVar8 = zds->inPos;
              }
              src_01 = (void *)((long)src_01 + uVar15);
              zds->inPos = sVar8 + uVar15;
              bVar9 = true;
              pvVar5 = src_01;
              if (uVar14 <= uVar15) {
                sVar8 = ZSTD_decompressContinue
                                  (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart
                                   ,zds->inBuff,sVar17);
                if (0xffffffffffffff88 < sVar8) {
                  return sVar8;
                }
                zds->inPos = 0;
                if ((ZVar12 != ZSTDds_skipFrame) && (sVar8 == 0)) {
                  zds->streamStage = zdss_read;
                  goto LAB_00186e10;
                }
                sVar17 = zds->outStart;
                sVar8 = sVar8 + sVar17;
                zds->outEnd = sVar8;
                zds->streamStage = zdss_flush;
LAB_00186d20:
                uVar15 = sVar8 - sVar17;
                uVar19 = (long)pvVar4 + (uVar3 - (long)local_98);
                uVar14 = uVar15;
                if (uVar19 < uVar15) {
                  uVar14 = uVar19;
                }
                memcpy(local_98,zds->outBuff + sVar17,uVar14);
                local_98 = (void *)((long)local_98 + uVar14);
                sVar17 = uVar14 + zds->outStart;
                zds->outStart = sVar17;
                bVar9 = true;
                pvVar5 = src_01;
                if (uVar15 <= uVar19) {
                  zds->streamStage = zdss_read;
                  bVar9 = false;
                  if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
                     (bVar9 = false, zds->outBuffSize < sVar17 + (zds->fParams).blockSizeMax)) {
                    zds->outStart = 0;
                    zds->outEnd = 0;
                    bVar9 = false;
                  }
                }
              }
            }
          }
        }
        else {
          sVar8 = ZSTD_decompress_usingDDict(zds,local_98,uVar15,src_00,sVar17,zds->ddict);
          if (0xffffffffffffff88 < sVar8) {
            return sVar8;
          }
          local_98 = (void *)((long)local_98 + sVar8);
          zds->expected = 0;
          zds->streamStage = zdss_init;
          bVar9 = true;
          pvVar5 = (void *)(sVar17 + (long)src_00);
        }
      }
      uVar18 = (long)src_01 + (input->pos - (long)src_00);
      input->pos = uVar18;
      output->pos = (long)local_98 + (output->pos - (long)pvVar13);
      sVar17 = zds->expected;
      if (sVar17 == 0) {
        if (zds->outEnd == zds->outStart) {
          if (zds->hostageByte != 0) {
            if (input->size <= uVar18) {
              zds->streamStage = zdss_read;
              return 1;
            }
            input->pos = uVar18 + 1;
          }
          sStackY_c0 = 0;
        }
        else {
          sStackY_c0 = 1;
          if (zds->hostageByte == 0) {
            input->pos = uVar18 - 1;
            zds->hostageByte = 1;
          }
        }
      }
      else {
        ZVar6 = ZSTD_nextInputType(zds);
        sStackY_c0 = (sVar17 - zds->inPos) + (ulong)(ZVar6 == ZSTDnit_block) * 3;
      }
    }
  }
  return sStackY_c0;
LAB_00186ce8:
  ZVar12 = zds->stage;
  if (ZVar12 == ZSTDds_skipFrame) {
    sVar8 = 0;
  }
  else {
    sVar8 = zds->outBuffSize - zds->outStart;
  }
  sVar8 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar8,src_01,sVar17);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  src_01 = (void *)((long)src_01 + sVar17);
  if ((ZVar12 == ZSTDds_skipFrame) || (bVar9 = false, pvVar5 = src_01, sVar8 != 0)) {
    zds->outEnd = zds->outStart + sVar8;
    zds->streamStage = zdss_flush;
LAB_00186e10:
    bVar9 = false;
    pvVar5 = src_01;
  }
  goto LAB_0018691f;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const istart = (const char*)(input->src) + input->pos;
    const char* const iend = (const char*)(input->src) + input->size;
    const char* ip = istart;
    char* const ostart = (char*)(output->dst) + output->pos;
    char* const oend = (char*)(output->dst) + output->size;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    if (input->pos > input->size) {  /* forbidden */
        DEBUGLOG(5, "in: pos: %u   vs size: %u",
                    (U32)input->pos, (U32)input->size);
        return ERROR(srcSize_wrong);
    }
    if (output->pos > output->size) {  /* forbidden */
        DEBUGLOG(5, "out: pos: %u   vs size: %u",
                    (U32)output->pos, (U32)output->size);
        return ERROR(dstSize_tooSmall);
    }
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            ZSTD_resetDStream(zds);   /* transparent reset on starting decoding a new frame */
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                /* legacy support is incompatible with static dctx */
                if (zds->staticSize) return ERROR(memory_allocation);
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        const void* const dict = zds->ddict ? zds->ddict->dictContent : NULL;
                        size_t const dictSize = zds->ddict ? zds->ddict->dictSize : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        /* legacy support is incompatible with static dctx */
                        if (zds->staticSize) return ERROR(memory_allocation);
                        CHECK_F(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX(ZSTD_frameHeaderSize_min, hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, zds->ddict);
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            CHECK_F(ZSTD_decompressBegin_usingDDict(zds, zds->ddict));

            if ((MEM_readLE32(zds->headerBuffer) & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_frameIdSize);
                zds->stage = ZSTDds_skipFrame;
            } else {
                CHECK_F(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            if (zds->fParams.windowSize > zds->maxWindowSize) return ERROR(frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);
                if ((zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize)) {
                    size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                    DEBUGLOG(4, "inBuff  : from %u to %u",
                                (U32)zds->inBuffSize, (U32)neededInBuffSize);
                    DEBUGLOG(4, "outBuff : from %u to %u",
                                (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                    if (zds->staticSize) {  /* static DCtx */
                        DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                        assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                        if (bufferSize > zds->staticSize - sizeof(ZSTD_DCtx))
                            return ERROR(memory_allocation);
                    } else {
                        ZSTD_free(zds->inBuff, zds->customMem);
                        zds->inBuffSize = 0;
                        zds->outBuffSize = 0;
                        zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                        if (zds->inBuff == NULL) return ERROR(memory_allocation);
                    }
                    zds->inBuffSize = neededInBuffSize;
                    zds->outBuff = zds->inBuff + zds->inBuffSize;
                    zds->outBuffSize = neededOutBuffSize;
            }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    if (toLoad > zds->inBuffSize - zds->inPos) return ERROR(corruption_detected);   /* should never happen */
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default: return ERROR(GENERIC);   /* impossible */
    }   }

    /* result */
    input->pos += (size_t)(ip-istart);
    output->pos += (size_t)(op-ostart);
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}